

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgException.h
# Opt level: O2

void __thiscall
TCLAP::ArgException::ArgException(ArgException *this,string *text,string *id,string *td)

{
  *(undefined ***)this = &PTR__ArgException_0014d880;
  std::__cxx11::string::string((string *)&this->_errorText,(string *)text);
  std::__cxx11::string::string((string *)&this->_argId,(string *)id);
  std::__cxx11::string::string((string *)&this->_typeDescription,(string *)td);
  return;
}

Assistant:

ArgException( const std::string& text = "undefined exception", 
					  const std::string& id = "undefined",
					  const std::string& td = "Generic ArgException")
			: std::exception(), 
			  _errorText(text), 
			  _argId( id ), 
			  _typeDescription(td)
		{ }